

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O3

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::CLDeviceIDs>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  vector<int,_std::allocator<int>_> *this;
  void *pvVar1;
  Entry local_30;
  
  this = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (info->parse == (GenericParseFunc)0x0) {
    pvVar1 = findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    std::vector<int,_std::allocator<int>_>::operator=
              (this,(vector<int,_std::allocator<int>_> *)((long)pvVar1 + 8));
  }
  else {
    (*info->parse)(src,this);
  }
  local_30.destructor = TypedFieldValueTraits<std::vector<int,_std::allocator<int>_>_>::destroy;
  local_30.value = this;
  TypedFieldMap::set(dst,(type_info *)&tcu::opt::CLDeviceIDs::typeinfo,&local_30);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}